

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadMessageNoVirtual<CoreML::Specification::SliceStaticLayerParams>
               (CodedInputStream *input,SliceStaticLayerParams *value)

{
  bool bVar1;
  pair<int,_int> pVar2;
  Limit local_2c;
  pair<int,_int> p;
  int length;
  SliceStaticLayerParams *value_local;
  CodedInputStream *input_local;
  
  unique0x10000061 = value;
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&p.first);
  if (((bVar1) &&
      (pVar2 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,p.first),
      -1 < (long)pVar2)) &&
     (bVar1 = CoreML::Specification::SliceStaticLayerParams::MergePartialFromCodedStream
                        (stack0xffffffffffffffe0,input), bVar1)) {
    local_2c = pVar2.first;
    bVar1 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,local_2c);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessageNoVirtual(
    io::CodedInputStream* input, MessageType_WorkAroundCppLookupDefect* value) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  std::pair<io::CodedInputStream::Limit, int> p =
      input->IncrementRecursionDepthAndPushLimit(length);
  if (p.second < 0 || !value->
      MessageType_WorkAroundCppLookupDefect::MergePartialFromCodedStream(input))
    return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  return input->DecrementRecursionDepthAndPopLimit(p.first);
}